

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgtDecide.c
# Opt level: O2

int Cgt_ManCheckGateComplete
              (Aig_Man_t *pAig,Vec_Vec_t *vGatesAll,Aig_Obj_t *pGate,Vec_Ptr_t *vFanout)

{
  void **ppvVar1;
  int iVar2;
  Aig_Obj_t *pObj;
  Vec_Ptr_t *pVVar3;
  ulong uVar4;
  ulong uVar5;
  int i;
  
  i = 0;
  while( true ) {
    if (vFanout->nSize <= i) {
      return 1;
    }
    pObj = (Aig_Obj_t *)Vec_PtrEntry(vFanout,i);
    if (((*(uint *)&pObj->field_0x18 & 7) == 3) &&
       (iVar2 = Aig_ObjCioId(pObj), iVar2 < pAig->nTruePos)) break;
    iVar2 = Aig_ObjCioId(pObj);
    pVVar3 = Vec_VecEntry(vGatesAll,iVar2 - pAig->nTruePos);
    uVar4 = (ulong)(uint)pVVar3->nSize;
    if (pVVar3->nSize < 1) {
      uVar4 = 0;
    }
    uVar5 = 0;
    do {
      if (uVar4 == uVar5) {
        return 0;
      }
      ppvVar1 = pVVar3->pArray + uVar5;
      uVar5 = uVar5 + 1;
    } while ((Aig_Obj_t *)*ppvVar1 != pGate);
    i = i + 1;
  }
  return 0;
}

Assistant:

int Cgt_ManCheckGateComplete( Aig_Man_t * pAig, Vec_Vec_t * vGatesAll, Aig_Obj_t * pGate, Vec_Ptr_t * vFanout )
{
    Vec_Ptr_t * vGates;
    Aig_Obj_t * pObj;
    int i;
    Vec_PtrForEachEntry( Aig_Obj_t *, vFanout, pObj, i )
    {
        if ( Saig_ObjIsPo(pAig, pObj) )
            return 0;
        vGates = Vec_VecEntry( vGatesAll, Aig_ObjCioId(pObj) - Saig_ManPoNum(pAig) );
        if ( Vec_PtrFind( vGates, pGate ) == -1 )
            return 0;            
    }
    return 1;
}